

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

int ly_register_exts(lyext_plugin_list *plugin,char *log_name)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  char *__s1;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  LY_ERR no;
  uint uVar7;
  int iVar8;
  lyext_plugin_list *plVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  lyext_plugin_list *plVar16;
  char *__s1_00;
  
  plVar9 = ext_plugins;
  uVar7 = (uint)ext_plugins_count;
  uVar12 = (ulong)ext_plugins_count;
  uVar13 = 0;
  do {
    __s1 = plugin[uVar13].name;
    if (__s1 == (char *)0x0) {
      plVar9 = (lyext_plugin_list *)realloc(plVar9,(ulong)((int)uVar13 + uVar7) << 5);
      if (plVar9 == (lyext_plugin_list *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_register_exts")
        ;
        iVar8 = -1;
      }
      else {
        ext_plugins = plVar9;
        for (lVar15 = uVar13 << 5; lVar15 != 0; lVar15 = lVar15 + -0x20) {
          uVar12 = (ulong)((uVar7 & 0xffff) << 5);
          puVar1 = (undefined8 *)((long)&plugin[-1].module + lVar15);
          uVar4 = *puVar1;
          uVar5 = puVar1[1];
          puVar1 = (undefined8 *)((long)plugin + lVar15 + -0x10);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)&plVar9->name + uVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          puVar1 = (undefined8 *)((long)&plVar9->module + uVar12);
          *puVar1 = uVar4;
          puVar1[1] = uVar5;
          uVar7 = uVar7 + 1;
          ext_plugins_count = (uint16_t)uVar7;
        }
        iVar8 = 0;
      }
      return iVar8;
    }
    plVar16 = plugin + uVar13;
    for (lVar15 = 0; uVar12 << 5 != lVar15; lVar15 = lVar15 + 0x20) {
      iVar8 = strcmp(__s1,*(char **)((long)&plVar9->name + lVar15));
      if (iVar8 == 0) {
        __s1_00 = plVar16->module;
        iVar8 = strcmp(__s1_00,*(char **)((long)&plVar9->module + lVar15));
        if ((iVar8 == 0) &&
           (((plVar16->revision == (char *)0x0 ||
             (pcVar11 = *(char **)((long)&plVar9->revision + lVar15), pcVar11 == (char *)0x0)) ||
            (iVar8 = strcmp(plVar16->revision,pcVar11), iVar8 == 0)))) {
          pcVar11 = 
          "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
          ;
          no = LY_ESYS;
          goto LAB_0016a73f;
        }
      }
    }
    if ((plVar16->plugin->type == LYEXT_COMPLEX) &&
       (lVar15 = *(long *)(plVar16->plugin + 1), lVar15 != 0)) {
      uVar10 = 0;
      while( true ) {
        lVar14 = uVar10 * 0x18;
        uVar3 = *(uint *)(lVar15 + lVar14);
        if (uVar3 == 0) break;
        if (((0x37 < (int)uVar3) || (uVar3 == 0x16)) || (uVar3 == 0x13)) {
          __s1_00 = ly_stmt_str[uVar3];
          pcVar11 = 
          "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)";
          goto LAB_0016a73d;
        }
        uVar10 = (ulong)((int)uVar10 + 1);
        if ((uVar3 - 0x14 < 7) && (1 < *(uint *)(lVar14 + lVar15 + 0x10))) {
          __s1_00 = ly_stmt_str[uVar3];
          pcVar11 = 
          "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" substatement, which is not supported."
          ;
LAB_0016a73d:
          no = LY_EINVAL;
LAB_0016a73f:
          ly_log((ly_ctx *)0x0,LY_LLERR,no,pcVar11,log_name,__s1,__s1_00);
          return 1;
        }
      }
    }
    uVar13 = (ulong)((int)uVar13 + 1);
  } while( true );
}

Assistant:

API int
ly_register_exts(struct lyext_plugin_list *plugin, const char *log_name)
{
    struct lyext_plugin_list *p;
    struct lyext_plugin_complex *pluginc;
    uint32_t u, v;

    for (u = 0; plugin[u].name; u++) {
        /* check extension implementations for collisions */
        for (v = 0; v < ext_plugins_count; v++) {
            if (!strcmp(plugin[u].name, ext_plugins[v].name) &&
                    !strcmp(plugin[u].module, ext_plugins[v].module) &&
                    (!plugin[u].revision || !ext_plugins[v].revision || !strcmp(plugin[u].revision, ext_plugins[v].revision))) {
                LOGERR(NULL, LY_ESYS, "Processing \"%s\" extension plugin failed,"
                        "implementation collision for extension %s from module %s%s%s.",
                        log_name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                        plugin[u].revision ? plugin[u].revision : "");
                return 1;
            }
        }

        /* check for valid supported substatements in case of complex extension */
        if (plugin[u].plugin->type == LYEXT_COMPLEX && ((struct lyext_plugin_complex *)plugin[u].plugin)->substmt) {
            pluginc = (struct lyext_plugin_complex *)plugin[u].plugin;
            for (v = 0; pluginc->substmt[v].stmt; v++) {
                if (pluginc->substmt[v].stmt >= LY_STMT_SUBMODULE ||
                        pluginc->substmt[v].stmt == LY_STMT_VERSION ||
                        pluginc->substmt[v].stmt == LY_STMT_YINELEM) {
                    LOGERR(NULL, LY_EINVAL,
                            "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)",
                            log_name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                    return 1;
                }
                if (pluginc->substmt[v].cardinality > LY_STMT_CARD_MAND &&
                        pluginc->substmt[v].stmt >= LY_STMT_MODIFIER &&
                        pluginc->substmt[v].stmt <= LY_STMT_STATUS) {
                    LOGERR(NULL, LY_EINVAL, "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" "
                           "substatement, which is not supported.",
                           log_name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                    return 1;
                }
            }
        }
    }

    /* add the new plugins, we have number of new plugins as u */
    p = realloc(ext_plugins, (ext_plugins_count + u) * sizeof *ext_plugins);
    if (!p) {
        LOGMEM(NULL);
        return -1;
    }
    ext_plugins = p;
    for (; u; u--) {
        memcpy(&ext_plugins[ext_plugins_count], &plugin[u - 1], sizeof *plugin);
        ext_plugins_count++;
    }

    return 0;
}